

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getSiteLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,double *outLogLikelihoods)

{
  uint length;
  int *piVar1;
  float *pfVar2;
  float *from;
  ulong uVar3;
  
  if (this->kPatternsReordered == true) {
    length = this->kPatternCount;
    from = (float *)malloc((long)(int)length << 2);
    piVar1 = this->gPatternsNewOrder;
    pfVar2 = this->outLogLikelihoodsTmp;
    for (uVar3 = 0; (~((int)length >> 0x1f) & length) != uVar3; uVar3 = uVar3 + 1) {
      from[uVar3] = pfVar2[piVar1[uVar3]];
    }
    beagleMemCpy<double,float>(outLogLikelihoods,from,length);
    free(from);
  }
  else {
    beagleMemCpy<double,float>(outLogLikelihoods,this->outLogLikelihoodsTmp,this->kPatternCount);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getSiteLogLikelihoods(double* outLogLikelihoods) {
    if (kPatternsReordered) {
        REALTYPE* outLogLikelihoodsOriginalOrder = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount);
        for (int i=0; i < kPatternCount; i++) {
            outLogLikelihoodsOriginalOrder[i] = outLogLikelihoodsTmp[gPatternsNewOrder[i]];
        }
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsOriginalOrder, kPatternCount);
        free(outLogLikelihoodsOriginalOrder);
    } else {
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsTmp, kPatternCount);
    }

    return BEAGLE_SUCCESS;
}